

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O0

PostType __thiscall
tiger::trains::ai::LineBlocker::getPostTypeByGood(LineBlocker *this,GoodType type)

{
  GoodType type_local;
  LineBlocker *this_local;
  undefined4 local_4;
  
  if (type == PRODUCT) {
    local_4 = MARKET;
  }
  else if (type == ARMOR) {
    local_4 = STORAGE;
  }
  else {
    local_4 = UNKNOWN;
  }
  return local_4;
}

Assistant:

tiger::trains::models::PostType LineBlocker::getPostTypeByGood(tiger::trains::models::GoodType type)
{
    switch (type)
    {
    case models::GoodType::PRODUCT:
        return models::PostType::MARKET;
        break;

    case models::GoodType::ARMOR:
        return models::PostType::STORAGE;
        break;

    default:
        return models::PostType::UNKNOWN;
        break;
    }
}